

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O1

FILE * Minisat::open_to_read_file(char *path)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  FILE *pFVar4;
  FILE *pFVar5;
  
  sVar3 = strlen(path);
  if ((sVar3 < 4) || (iVar2 = strcmp(path + (sVar3 - 4),".bz2"), iVar2 != 0)) {
    pFVar4 = (FILE *)0x0;
  }
  else {
    pFVar4 = read_pipe("bzip2 -c -d %s",(int *)bz2sig,path);
  }
  if (pFVar4 != (FILE *)0x0) {
    return pFVar4;
  }
  sVar3 = strlen(path);
  if ((sVar3 < 3) || (iVar2 = strcmp(path + (sVar3 - 3),".gz"), iVar2 != 0)) {
    pFVar4 = (FILE *)0x0;
  }
  else {
    pFVar4 = read_pipe("gzip -c -d %s",(int *)gzsig,path);
  }
  if (pFVar4 != (FILE *)0x0) {
    return pFVar4;
  }
  sVar3 = strlen(path);
  if ((sVar3 < 5) || (iVar2 = strcmp(path + (sVar3 - 5),".lzma"), iVar2 != 0)) {
    pFVar4 = (FILE *)0x0;
  }
  else {
    pFVar4 = read_pipe("lzma -c -d %s",(int *)lzmasig,path);
  }
  if (pFVar4 == (FILE *)0x0) {
    sVar3 = strlen(path);
    if ((sVar3 < 3) || (iVar2 = strcmp(path + (sVar3 - 3),".7z"), iVar2 != 0)) {
      pFVar4 = (FILE *)0x0;
    }
    else {
      pFVar4 = read_pipe("7z x -so %s 2>/dev/null",(int *)sig7z,path);
    }
    if (pFVar4 == (FILE *)0x0) {
      bVar1 = has_suffix(path,".xz");
      if (bVar1) {
        pFVar4 = read_pipe("xz -c -d %s",(int *)xzsig,path);
      }
      else {
        pFVar4 = (FILE *)0x0;
      }
      if (pFVar4 == (FILE *)0x0) {
        pFVar5 = fopen(path,"r");
        return (FILE *)pFVar5;
      }
    }
    return pFVar4;
  }
  return pFVar4;
}

Assistant:

inline FILE *open_to_read_file(const char *path)
{
    FILE *file = NULL;
#define READ_PIPE(SUFFIX, CMD, SIG)                                                                                    \
    do {                                                                                                               \
        if (has_suffix(path, SUFFIX)) {                                                                                \
            file = read_pipe(CMD, SIG, path);                                                                          \
        }                                                                                                              \
    } while (0)

    READ_PIPE(".bz2", "bzip2 -c -d %s", bz2sig);
    if (file) return file;
    READ_PIPE(".gz", "gzip -c -d %s", gzsig);
    if (file) return file;
    READ_PIPE(".lzma", "lzma -c -d %s", lzmasig);
    if (file) return file;
    READ_PIPE(".7z", "7z x -so %s 2>/dev/null", sig7z);
    if (file) return file;
    READ_PIPE(".xz", "xz -c -d %s", xzsig);
    if (file) return file;

    file = fopen(path, "r");
    return file;
}